

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  char *pcVar1;
  xpath_node *pxVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  char *__s1;
  bool bVar7;
  xpath_node local_38;
  
  __s1 = "";
  if (a->name != (char_t *)0x0) {
    __s1 = a->name;
  }
  bVar7 = false;
  switch(this->_test) {
  case '\x01':
    iVar4 = strcmp(__s1,(this->_data).string);
    if (iVar4 != 0) {
      return false;
    }
    if (*__s1 == 'x') {
      lVar5 = 0;
      do {
        cVar6 = "xmlns"[lVar5 + 1];
        if (lVar5 == 4) break;
        lVar3 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (__s1[lVar3] == cVar6);
LAB_00167ce5:
      if (cVar6 == '\0') {
        if (__s1[5] == '\0') {
          return false;
        }
        if (__s1[5] == ':') {
          return false;
        }
      }
    }
    break;
  case '\x02':
  case '\a':
    if (*__s1 == 'x') {
      lVar5 = 0;
      do {
        cVar6 = "xmlns"[lVar5 + 1];
        if (lVar5 == 4) break;
        lVar3 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (__s1[lVar3] == cVar6);
      goto LAB_00167ce5;
    }
    break;
  default:
    goto switchD_00167c0e_caseD_3;
  case '\b':
    cVar6 = *(this->_data).string;
    bVar7 = cVar6 == '\0';
    if ((!bVar7) && (*__s1 == cVar6)) {
      lVar5 = 1;
      do {
        cVar6 = (this->_data).string[lVar5];
        bVar7 = cVar6 == '\0';
        if (bVar7) break;
        pcVar1 = __s1 + lVar5;
        lVar5 = lVar5 + 1;
      } while (*pcVar1 == cVar6);
    }
    if (!bVar7) {
      return false;
    }
    if (*__s1 == 'x') {
      lVar5 = 0;
      do {
        cVar6 = "xmlns"[lVar5 + 1];
        if (lVar5 == 4) break;
        lVar3 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (__s1[lVar3] == cVar6);
      goto LAB_00167ce5;
    }
  }
  if (a == (xml_attribute_struct *)0x0) {
    parent = (xml_node_struct *)0x0;
  }
  pxVar2 = ns->_end;
  if (pxVar2 == ns->_eos) {
    local_38._node._root = parent;
    local_38._attribute._attr = a;
    xpath_node_set_raw::push_back_grow(ns,&local_38,alloc);
  }
  else {
    ns->_end = pxVar2 + 1;
    (pxVar2->_node)._root = parent;
    (pxVar2->_attribute)._attr = a;
  }
  bVar7 = true;
switchD_00167c0e_caseD_3:
  return bVar7;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}